

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O2

int apply_moves(node *newest_node,Pyraminx *pyraminx)

{
  pointer pmVar1;
  pointer pmVar2;
  vector<move_type,_std::allocator<move_type>_> move_list;
  
  get_move_list(&move_list,newest_node);
  pmVar2 = move_list.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pmVar1 = move_list.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pmVar1 != move_list.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                super__Vector_impl_data._M_start; pmVar1 = pmVar1 + -1) {
    pmVar2 = pmVar2 + -1;
    Pyraminx::turn_layer(pyraminx,pmVar1[-1].ref_corner,pmVar1[-1].layer,pmVar1[-1].dir);
  }
  std::_Vector_base<move_type,_std::allocator<move_type>_>::~_Vector_base
            (&move_list.super__Vector_base<move_type,_std::allocator<move_type>_>);
  return (int)(((long)move_list.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pmVar2) / 0xc);
}

Assistant:

int apply_moves(const node* newest_node, Pyraminx& pyraminx){
    std::vector<move_type> move_list = get_move_list(newest_node);
    for(auto it = move_list.rbegin(); it != move_list.rend(); ++it){
        pyraminx.turn_layer(it->ref_corner, it->layer, it->dir);
    }
    return move_list.size(); // new g value
}